

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int balance(BtCursor *pCur)

{
  void *pvVar1;
  byte bVar2;
  u8 uVar3;
  ushort uVar4;
  u32 uVar5;
  MemPage *pMVar6;
  BtShared *pBVar7;
  uint *puVar8;
  PgHdr *pPVar9;
  MemPage *pPg;
  u16 uVar10;
  ushort uVar11;
  ushort uVar12;
  Pgno PVar13;
  uint uVar14;
  undefined6 extraout_var;
  undefined1 *puVar15;
  ulong uVar16;
  ulong extraout_RAX;
  char cVar17;
  int iVar18;
  undefined8 uVar19;
  u8 *puVar20;
  long lVar21;
  MemPage **ppMVar22;
  uint uVar23;
  int iNew;
  u8 *puVar24;
  ulong uVar25;
  ulong uVar26;
  u8 *puVar27;
  MemPage *pMVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  u8 **ppuVar33;
  uint uVar34;
  uint N;
  u8 *puVar35;
  uint uVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  MemPage *apOld [3];
  int cntNew [5];
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  Pgno pgnoNew;
  Pgno aPgOrder [5];
  int cntOld [5];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  u8 *apDiv [2];
  Pgno local_27c;
  u8 **local_278;
  char local_269;
  MemPage *local_268;
  u8 **local_260;
  ulong local_258;
  ulong local_250;
  undefined1 *local_248;
  u8 *local_240;
  u8 **local_238;
  MemPage *local_230;
  BtShared *local_228;
  ulong local_220;
  Pgno local_214;
  CellArray local_210;
  MemPage *local_1f0;
  ulong local_1e8;
  undefined1 local_1e0 [8];
  undefined8 local_1d8;
  uint uStack_1bc;
  uint local_1b8 [8];
  ulong local_198;
  undefined8 local_190;
  uint auStack_188 [8];
  char local_168 [8];
  MemPage *local_160;
  uint local_154;
  ulong local_150;
  void *local_148;
  void *local_140;
  MemPage *local_138;
  long local_130 [5];
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  undefined8 local_f0;
  Pgno PStack_d8;
  uint local_d4 [6];
  uint auStack_bc [7];
  ulong local_a0;
  long local_98;
  uint *local_90;
  ulong local_88;
  u16 auStack_80 [5];
  u8 local_75 [4];
  u8 auStack_71 [9];
  Pgno aPStack_68 [6];
  undefined1 local_50 [8];
  undefined8 auStack_48 [3];
  
  local_88 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  cVar17 = pCur->iPage;
  pMVar28 = pCur->pPage;
  local_148 = (void *)0x0;
  local_190 = pCur;
LAB_00159ab9:
  if (cVar17 == '\0') {
    if (pMVar28->nOverflow == '\0') goto LAB_0015b41f;
    local_138 = (MemPage *)0x0;
    local_1d8._0_4_ = 0;
    pBVar7 = pMVar28->pBt;
    PVar13 = sqlite3PagerWrite(pMVar28->pDbPage);
    if (PVar13 == 0) {
      iVar37 = allocateBtreePage(pBVar7,&local_138,(Pgno *)&local_1d8,pMVar28->pgno,'\0');
      pMVar6 = local_138;
      local_210.nCell = iVar37;
      copyNodeContent(pMVar28,local_138,&local_210.nCell);
      if (pBVar7->autoVacuum != '\0') {
        ptrmapPut(pBVar7,(Pgno)local_1d8,'\x05',pMVar28->pgno,&local_210.nCell);
      }
      PVar13 = local_210.nCell;
      if (local_210.nCell == 0) {
        memcpy(pMVar6->aiOvfl,pMVar28->aiOvfl,(ulong)((uint)pMVar28->nOverflow * 2));
        memcpy(pMVar6->apOvfl,pMVar28->apOvfl,(ulong)pMVar28->nOverflow << 3);
        pMVar6->nOverflow = pMVar28->nOverflow;
        zeroPage(pMVar28,*pMVar6->aData & 0xfffffff7);
        *(Pgno *)(pMVar28->aData + (ulong)pMVar28->hdrOffset + 8) =
             (Pgno)local_1d8 >> 0x18 | ((Pgno)local_1d8 & 0xff0000) >> 8 |
             ((Pgno)local_1d8 & 0xff00) << 8 | (Pgno)local_1d8 << 0x18;
        pCur->apPage[1] = pMVar6;
        pCur->iPage = '\x01';
        pCur->ix = 0;
        pCur->aiIdx[0] = 0;
        pCur->apPage[0] = pMVar28;
        PVar13 = 0;
        cVar17 = '\x01';
        pMVar28 = pMVar6;
        goto LAB_0015a8ea;
      }
      pCur->apPage[1] = (MemPage *)0x0;
      if (pMVar6 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
      }
    }
    else {
      pCur->apPage[1] = (MemPage *)0x0;
    }
  }
  else {
    if ((pMVar28->nOverflow != '\0') || ((uint)local_88 < pMVar28->nFree)) {
      pMVar6 = pCur->apPage[(long)cVar17 + -1];
      uVar11 = pCur->aiIdx[(long)cVar17 + -1];
      PVar13 = sqlite3PagerWrite(pMVar6->pDbPage);
      pCur = local_190;
      if (PVar13 == 0) {
        local_269 = cVar17;
        local_230 = pMVar6;
        local_160 = pMVar28;
        if ((((pMVar28->intKeyLeaf != '\0') && (pMVar28->nOverflow == '\x01')) &&
            (pMVar28->aiOvfl[0] == pMVar28->nCell)) &&
           ((pMVar6->pgno != 1 && (pMVar6->nCell == uVar11)))) {
          if (pMVar28->aiOvfl[0] == 0) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11049);
            pMVar28 = local_160;
            PVar13 = 0xb;
          }
          else {
            pBVar7 = pMVar28->pBt;
            PVar13 = allocateBtreePage(pBVar7,&local_138,(Pgno *)&local_f0,0,'\0');
            pMVar28 = local_160;
            if (PVar13 == 0) {
              puVar27 = local_160->apOvfl[0];
              local_210._0_8_ = puVar27;
              uVar10 = (*local_160->xCellSize)(local_160,puVar27);
              pPg = local_138;
              local_258 = CONCAT44(local_258._4_4_,(int)CONCAT62(extraout_var,uVar10));
              local_1b8[0] = CONCAT22(local_1b8[0]._2_2_,uVar10);
              zeroPage(local_138,0xd);
              PVar13 = rebuildPage(pPg,1,(u8 **)&local_210,(u16 *)local_1b8);
              pMVar6 = local_230;
              pMVar28 = local_160;
              local_1d8._0_4_ = PVar13;
              if (PVar13 == 0) {
                pPg->nFree = ((short)pBVar7->usableSize - (pPg->cellOffset + (short)local_258)) - 2;
                if ((pBVar7->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar7,(Pgno)local_f0,'\x05',local_230->pgno,(int *)&local_1d8),
                   pPg->minLocal < (ushort)local_258)) {
                  ptrmapPutOvflPtr(pPg,puVar27,(int *)&local_1d8);
                }
                uVar26 = (ulong)(CONCAT11(local_160->aCellIdx[(ulong)local_160->nCell * 2 + -2],
                                          local_160->aCellIdx[(ulong)local_160->nCell * 2 + -1]) &
                                local_160->maskPage);
                uVar30 = 0;
                puVar27 = local_160->aData + uVar26;
                puVar35 = local_160->aData + uVar26 + 2;
                do {
                  puVar24 = puVar35;
                  puVar20 = puVar27;
                  if (7 < uVar30) break;
                  uVar30 = uVar30 + 1;
                  puVar27 = puVar20 + 1;
                  puVar35 = puVar24 + 1;
                } while ((char)*puVar20 < '\0');
                lVar21 = 4;
                do {
                  uVar3 = puVar24[-1];
                  local_75[lVar21] = uVar3;
                  lVar21 = lVar21 + 1;
                  if (-1 < (char)uVar3) break;
                  bVar41 = puVar24 < puVar20 + 10;
                  puVar24 = puVar24 + 1;
                } while (bVar41);
                if ((Pgno)local_1d8 == 0) {
                  insertCell(pMVar6,(uint)pMVar6->nCell,local_75,(int)lVar21,(u8 *)0x0,
                             local_160->pgno,(int *)&local_1d8);
                }
                *(Pgno *)(pMVar6->aData + (ulong)pMVar6->hdrOffset + 8) =
                     (Pgno)local_f0 >> 0x18 | ((Pgno)local_f0 & 0xff0000) >> 8 |
                     ((Pgno)local_f0 & 0xff00) << 8 | (Pgno)local_f0 << 0x18;
                pMVar28 = local_160;
                PVar13 = (Pgno)local_1d8;
                if (pPg != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pPg->pDbPage);
                  pMVar28 = local_160;
                  PVar13 = (Pgno)local_1d8;
                }
              }
            }
          }
          goto LAB_0015a8c4;
        }
        local_140 = pcache1Alloc(local_190->pBt->pageSize);
        local_168[0] = '\0';
        local_168[1] = '\0';
        local_168[2] = '\0';
        local_168[3] = '\0';
        local_168[4] = 0;
        local_210._0_8_ = local_210._0_8_ & 0xffffffff00000000;
        local_210.apCell = (u8 **)0x0;
        if (local_140 != (void *)0x0) {
          uVar23 = pCur->hints & 1;
          local_f8 = (ulong)uVar23;
          uVar36 = (uint)local_230->nCell + (uint)local_230->nOverflow;
          local_100 = 0;
          if (1 < uVar36) {
            uVar34 = (uint)uVar11;
            if (uVar34 == 0) {
              local_100 = 0;
            }
            else if (uVar36 == uVar34) {
              local_100 = (ulong)((uVar11 + uVar23) - 2);
            }
            else {
              local_100 = (ulong)(uVar34 - 1);
            }
            uVar36 = 2 - uVar23;
          }
          uVar26 = (ulong)uVar36;
          uVar23 = ((int)local_100 - (uint)local_230->nOverflow) + uVar36;
          if (uVar23 == local_230->nCell) {
            uVar30 = (ulong)local_230->hdrOffset + 8;
          }
          else {
            uVar30 = (ulong)(CONCAT11(local_230->aCellIdx[(long)(int)uVar23 * 2],
                                      local_230->aCellIdx[(long)(int)uVar23 * 2 + 1]) &
                            local_230->maskPage);
          }
          local_90 = (uint *)(local_230->aData + uVar30);
          pBVar7 = local_230->pBt;
          local_1e0._4_4_ = uVar36 + 1;
          uVar23 = *local_90;
          uVar34 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                   uVar23 << 0x18;
          PVar13 = getAndInitPage(pBVar7,uVar34,(MemPage **)(&local_1d8 + uVar26),(BtCursor *)0x0,0)
          ;
          pMVar28 = local_230;
          uVar30 = (ulong)(uint)local_1e0._4_4_;
          uVar23 = local_1e0._4_4_;
          if (PVar13 != 0) {
LAB_00159e66:
            local_27c = PVar13;
            memset(&local_1d8,0,(long)(int)uVar23 << 3);
            uVar23 = 0;
            goto LAB_00159e7f;
          }
          local_260 = (u8 **)CONCAT44(local_260._4_4_,uVar34);
          pMVar6 = (MemPage *)(&local_1d8)[uVar26];
          iVar37 = (uint)pMVar6->nCell + (uint)pMVar6->nOverflow + 1;
          local_27c = PVar13;
          local_250 = uVar30;
          local_228 = pBVar7;
          local_220 = uVar26;
          local_150 = uVar26;
          if (uVar36 != 0) {
            local_238 = (u8 **)(ulong)(((int)local_100 + uVar36) - 1);
            local_240 = (u8 *)((long)&local_190 + uVar26 * 4 + 4);
            local_248 = local_50 + uVar36 * 8;
            local_1f0 = (MemPage *)(local_1e0 + uVar36 * 8);
            lVar21 = 0;
            ppuVar33 = (u8 **)0x0;
            local_258 = uVar26;
            do {
              local_258 = local_258 - 1;
              iVar18 = (int)lVar21;
              if (pMVar28->nOverflow == 0) {
                iVar31 = (int)local_238 + iVar18;
LAB_00159ff4:
                puVar35 = pMVar28->aData;
                local_268 = (MemPage *)CONCAT44(local_268._4_4_,iVar31);
                lVar38 = (long)(int)(iVar31 - (uint)pMVar28->nOverflow);
                uVar11 = CONCAT11(pMVar28->aCellIdx[lVar38 * 2],pMVar28->aCellIdx[lVar38 * 2 + 1]) &
                         pMVar28->maskPage;
                puVar27 = puVar35 + uVar11;
                *(u8 **)(local_248 + lVar21 * 8) = puVar27;
                local_260 = (u8 **)CONCAT44(local_260._4_4_,*(undefined4 *)(puVar35 + uVar11));
                local_278 = ppuVar33;
                uVar10 = (*pMVar28->xCellSize)(pMVar28,puVar27);
                pvVar1 = local_140;
                uVar23 = (uint)uVar10;
                *(uint *)(local_240 + lVar21 * 4) = (uint)uVar10;
                if ((local_228->btsFlags & 0xc) != 0) {
                  iVar31 = (int)puVar27 - *(int *)&pMVar28->aData;
                  if ((int)local_228->usableSize < (int)(iVar31 + uVar23)) {
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1119e);
                    memset(&local_1d8,0,(size_t)(local_278 + local_220));
                    uVar30 = local_250;
                    uVar23 = 0;
                    PVar13 = 0xb;
                    goto LAB_00159e7f;
                  }
                  memcpy((void *)((long)iVar31 + (long)local_140),puVar27,(ulong)uVar23);
                  *(long *)(local_248 + lVar21 * 8) =
                       ((long)puVar27 - (long)pMVar28->aData) + (long)pvVar1;
                }
                PVar13 = (uint)local_260 >> 0x18 | ((uint)local_260 & 0xff0000) >> 8 |
                         ((uint)local_260 & 0xff00) << 8 | (uint)local_260 << 0x18;
                dropCell(pMVar28,(uint)local_268 - pMVar28->nOverflow,uVar23,(int *)&local_27c);
                ppuVar33 = local_278;
              }
              else {
                if ((int)local_238 + iVar18 != (uint)pMVar28->aiOvfl[0]) {
                  iVar31 = (int)local_100 + (int)local_258;
                  goto LAB_00159ff4;
                }
                puVar8 = (uint *)pMVar28->apOvfl[0];
                *(uint **)(local_248 + lVar21 * 8) = puVar8;
                uVar23 = *puVar8;
                PVar13 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                         uVar23 << 0x18;
                uVar10 = (*pMVar28->xCellSize)(pMVar28,(u8 *)puVar8);
                *(uint *)(local_240 + lVar21 * 4) = (uint)uVar10;
                pMVar28->nOverflow = '\0';
              }
              pMVar6 = local_1f0;
              local_260 = (u8 **)CONCAT44(local_260._4_4_,PVar13);
              PVar13 = getAndInitPage(local_228,PVar13,
                                      (MemPage **)((long)ppuVar33 + (long)local_1f0),(BtCursor *)0x0
                                      ,0);
              if (PVar13 != 0) {
                uVar30 = local_250;
                uVar23 = (int)local_220 + iVar18;
                goto LAB_00159e66;
              }
              iVar37 = iVar37 + (uint)*(ushort *)
                                       (*(long *)(pMVar6->aiOvfl + lVar21 * 4 + -0xd) + 0x16) +
                       (uint)*(byte *)(*(long *)(pMVar6->aiOvfl + lVar21 * 4 + -0xd) + 0xc) + 1;
              ppuVar33 = ppuVar33 + -1;
              lVar21 = lVar21 + -1;
              local_27c = PVar13;
            } while (local_220 + lVar21 != 0);
          }
          local_214 = (uint)local_260;
          uVar23 = iVar37 + 3U & 0xfffffffc;
          local_210.apCell = (u8 **)sqlite3Malloc((long)(int)(uVar23 * 10 + local_228->pageSize));
          uVar30 = local_250;
          if (local_210.apCell != (u8 **)0x0) {
            local_98 = (long)(int)uVar23;
            local_278 = local_210.apCell + local_98;
            local_1e8 = (long)local_278 + local_98 * 2;
            local_210.pRef = (MemPage *)CONCAT44(local_1d8._4_4_,(Pgno)local_1d8);
            local_154 = (uint)(local_210.pRef)->leaf;
            local_240 = (u8 *)((ulong)(local_210.pRef)->leaf << 2);
            local_248 = (undefined1 *)(ulong)(local_210.pRef)->intKeyLeaf;
            local_198 = (long)local_210.apCell + local_98 * 10;
            uVar26 = 0;
            iVar37 = 0;
            uVar23 = 0;
            local_238 = local_210.apCell;
            local_210.szCell = (u16 *)local_278;
            local_1f0 = local_210.pRef;
            do {
              lVar21 = (&local_1d8)[uVar26];
              puVar27 = *(u8 **)(lVar21 + 0x50);
              if (*puVar27 != *local_1f0->aData) {
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x111df);
                uVar23 = 0;
                PVar13 = 0xb;
                goto LAB_00159e7f;
              }
              uVar11 = *(ushort *)(lVar21 + 0x18);
              puVar35 = puVar27 + *(ushort *)(lVar21 + 0x12);
              lVar38 = (long)(int)uVar23;
              local_268 = (MemPage *)CONCAT44(local_268._4_4_,uVar23);
              local_258 = uVar26;
              memset((void *)((long)local_278 + lVar38 * 2),0,
                     (ulong)(((uint)*(byte *)(lVar21 + 0xc) + (uint)*(ushort *)(lVar21 + 0x16)) * 2)
                    );
              uVar30 = local_250;
              bVar2 = *(byte *)(lVar21 + 0xc);
              if ((ulong)bVar2 == 0) {
                uVar23 = (uint)local_268;
              }
              else {
                uVar12 = *(ushort *)(lVar21 + 0x1a);
                if (uVar12 != 0) {
                  lVar39 = lVar38 << 0x20;
                  lVar29 = 0;
                  do {
                    *(u8 **)((long)local_238 + lVar29 * 4 + lVar38 * 8) =
                         puVar27 + (uVar11 & CONCAT11(puVar35[lVar29],puVar35[lVar29 + 1]));
                    lVar39 = lVar39 + 0x100000000;
                    lVar29 = lVar29 + 2;
                  } while ((uint)uVar12 * 2 != (int)lVar29);
                  lVar38 = lVar39 >> 0x20;
                  puVar35 = puVar35 + lVar29;
                }
                uVar26 = 0;
                do {
                  local_238[lVar38 + uVar26] = *(u8 **)(lVar21 + 0x28 + uVar26 * 8);
                  uVar26 = uVar26 + 1;
                } while (bVar2 != uVar26);
                uVar23 = (int)lVar38 + (int)uVar26;
                local_210.nCell = uVar23;
              }
              uVar12 = *(ushort *)(lVar21 + 0x12);
              uVar4 = *(ushort *)(lVar21 + 0x16);
              if (puVar35 < puVar27 + (ulong)uVar4 * 2 + (ulong)uVar12) {
                lVar38 = (long)(int)uVar23;
                lVar29 = 0;
                do {
                  puVar24 = puVar35 + lVar29;
                  *(u8 **)((long)local_238 + lVar29 * 4 + lVar38 * 8) =
                       puVar27 + (CONCAT11(*puVar24,puVar24[1]) & uVar11);
                  uVar23 = uVar23 + 1;
                  local_210.nCell = uVar23;
                  lVar29 = lVar29 + 2;
                } while (puVar24 + 2 < puVar27 + (ulong)uVar4 * 2 + (ulong)uVar12);
              }
              auStack_bc[local_258 + 1] = uVar23;
              if ((local_258 < local_220) && ((char)local_248 == '\0')) {
                uVar36 = auStack_188[local_258] & 0xffff;
                lVar38 = (long)(int)uVar23;
                *(short *)((long)local_278 + lVar38 * 2) = (short)auStack_188[local_258];
                pvVar1 = (void *)(local_1e8 + (long)iVar37);
                iVar37 = iVar37 + uVar36;
                memcpy(pvVar1,(void *)auStack_48[local_258],(ulong)uVar36);
                puVar27 = (u8 *)((long)pvVar1 + (long)local_240);
                local_238[lVar38] = puVar27;
                uVar11 = *(short *)((long)local_278 + lVar38 * 2) - (short)local_240;
                *(ushort *)((long)local_278 + lVar38 * 2) = uVar11;
                if (*(char *)(lVar21 + 8) == '\0') {
                  *(undefined4 *)puVar27 = *(undefined4 *)(*(long *)(lVar21 + 0x50) + 8);
                }
                else if (uVar11 < 4) {
                  puVar15 = (undefined1 *)((long)iVar37 + local_198);
                  do {
                    *puVar15 = 0;
                    uVar11 = *(short *)((long)local_278 + lVar38 * 2) + 1;
                    *(ushort *)((long)local_278 + lVar38 * 2) = uVar11;
                    puVar15 = puVar15 + 1;
                    iVar37 = iVar37 + 1;
                  } while (uVar11 < 4);
                }
                uVar23 = uVar23 + 1;
                local_210.nCell = uVar23;
              }
              uVar26 = local_258 + 1;
            } while (uVar26 != uVar30);
            local_268 = (MemPage *)CONCAT44(local_268._4_4_,uVar23);
            local_a0 = (ulong)local_240 & 0xffff;
            local_258 = CONCAT44(local_258._4_4_,
                                 local_228->usableSize + (uint)(ushort)local_240 + -0xc);
            uVar26 = 0;
            do {
              lVar21 = (&local_1d8)[uVar26];
              uVar23 = (int)local_258 - (uint)*(ushort *)(lVar21 + 0x14);
              auStack_188[uVar26] = uVar23;
              if (*(char *)(lVar21 + 0xc) != '\0') {
                uVar30 = 0;
                do {
                  uVar11 = (**(code **)(lVar21 + 0x78))();
                  uVar23 = uVar23 + uVar11 + 2;
                  auStack_188[uVar26] = uVar23;
                  uVar30 = uVar30 + 1;
                } while (uVar30 < *(byte *)(lVar21 + 0xc));
              }
              local_1b8[uVar26] = auStack_bc[uVar26 + 1];
              uVar26 = uVar26 + 1;
            } while (uVar26 != local_250);
            uVar32 = (ulong)local_268 & 0xffffffff;
            local_108 = (long)(int)(uint)local_268;
            local_1e8 = -(long)(int)(uint)local_268;
            uVar26 = (ulong)(uint)local_1e0._4_4_;
            puVar27 = (u8 *)0x0;
            ppuVar33 = local_278;
            uVar30 = local_250;
            do {
              uVar23 = auStack_188[(long)puVar27];
              if ((int)local_258 < (int)uVar23) {
                puVar35 = puVar27 + 1;
                local_240 = puVar35;
                do {
                  if ((long)(int)uVar26 <= (long)puVar35) {
                    if ((u8 *)0x3 < puVar27) {
                      auStack_188[(long)puVar27] = uVar23;
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1124c);
                      uVar30 = local_250;
                      uVar23 = 0;
                      PVar13 = 0xb;
                      goto LAB_00159e7f;
                    }
                    auStack_188[(long)(puVar27 + 1)] = 0;
                    local_1b8[(long)(puVar27 + 1)] = (uint)uVar32;
                    uVar26 = (ulong)((int)puVar27 + 2);
                  }
                  uVar36 = local_1b8[(long)puVar27];
                  lVar21 = (long)(int)uVar36;
                  uVar40 = lVar21 - 1;
                  uVar11 = *(ushort *)((long)ppuVar33 + lVar21 * 2 + -2);
                  if (uVar11 == 0) {
                    uVar11 = computeCellSize(&local_210,(uint)uVar40);
                    uVar32 = (ulong)local_268 & 0xffffffff;
                    puVar35 = local_240;
                    ppuVar33 = local_278;
                  }
                  iVar37 = uVar11 + 2;
                  if (((int)local_248 == 0) && (iVar37 = 0, (int)uVar36 < (int)uVar32)) {
                    uVar12 = *(ushort *)((long)ppuVar33 + lVar21 * 2);
                    if (uVar12 == 0) {
                      uVar12 = computeCellSize(&local_210,uVar36);
                      uVar32 = (ulong)local_268 & 0xffffffff;
                      puVar35 = local_240;
                      ppuVar33 = local_278;
                    }
                    iVar37 = uVar12 + 2;
                  }
                  auStack_188[(long)(puVar27 + 1)] = auStack_188[(long)(puVar27 + 1)] + iVar37;
                  uVar23 = uVar23 - (uVar11 + 2);
                  local_1b8[(long)puVar27] = (uint)uVar40;
                  uVar30 = local_250;
                } while ((int)local_258 < (int)uVar23);
              }
              else {
                uVar40 = (ulong)local_1b8[(long)puVar27];
                puVar35 = puVar27 + 1;
              }
              auStack_188[(long)puVar27] = uVar23;
              if ((int)uVar40 < (int)uVar32) {
                lVar21 = (long)(int)uVar40;
                local_198 = uVar26;
                local_240 = puVar35;
                do {
                  lVar21 = lVar21 + 1;
                  uVar11 = *(ushort *)((long)ppuVar33 + lVar21 * 2 + -2);
                  iVar37 = (int)uVar40;
                  if (uVar11 == 0) {
                    uVar11 = computeCellSize(&local_210,iVar37);
                    uVar32 = (ulong)local_268 & 0xffffffff;
                    uVar26 = local_198;
                    puVar35 = local_240;
                    ppuVar33 = local_278;
                  }
                  uVar23 = uVar23 + uVar11 + 2;
                  if ((int)local_258 < (int)uVar23) {
                    if (puVar27 == (u8 *)0x0) {
                      uVar23 = 0;
                    }
                    else {
                      uVar23 = (&uStack_1bc)[(long)puVar27];
                    }
                    if ((int)uVar23 < iVar37) goto LAB_0015a6ed;
                    uVar23 = 0;
                    uVar19 = 0x1126d;
                    goto LAB_0015ae2a;
                  }
                  uVar36 = iVar37 + 1;
                  uVar40 = (ulong)uVar36;
                  auStack_188[(long)puVar27] = uVar23;
                  local_1b8[(long)puVar27] = uVar36;
                  if ((int)local_248 == 0) {
                    iVar37 = 0;
                    if (lVar21 < (long)local_108) {
                      uVar11 = *(ushort *)((long)ppuVar33 + lVar21 * 2);
                      if (uVar11 == 0) {
                        uVar11 = computeCellSize(&local_210,uVar36);
                        uVar32 = (ulong)local_268 & 0xffffffff;
                        uVar26 = local_198;
                        puVar35 = local_240;
                        ppuVar33 = local_278;
                      }
                      goto LAB_0015a6a5;
                    }
                  }
                  else {
LAB_0015a6a5:
                    iVar37 = uVar11 + 2;
                  }
                  auStack_188[(long)puVar35] = auStack_188[(long)puVar35] - iVar37;
                } while (local_1e8 + lVar21 != 0);
              }
              uVar26 = (ulong)puVar35 & 0xffffffff;
LAB_0015a6ed:
              puVar27 = puVar35;
            } while ((long)puVar35 < (long)(int)uVar26);
            local_198 = uVar26;
            local_108 = (ulong)((int)uVar26 - 1);
            local_238 = (u8 **)((long)local_238 + (local_98 * 8 - (ulong)(uint)((int)local_248 * 2))
                               );
            uVar26 = local_108;
            do {
              if ((int)uVar26 < 1) {
                local_278 = (u8 **)CONCAT44(local_278._4_4_,(uint)*local_1f0->aData);
                if ((int)local_198 < 1) {
                  uVar23 = 0;
                  local_1f0 = (MemPage *)((ulong)local_1f0 & 0xffffffff00000000);
                  goto LAB_0015ae55;
                }
                uVar26 = local_198 & 0xffffffff;
                uVar40 = 0;
                uVar36 = 0;
                goto LAB_0015abb8;
              }
              uVar23 = *(uint *)((long)&local_190 + uVar26 * 4 + 4);
              uVar36 = auStack_188[uVar26];
              uVar34 = (&uStack_1bc)[uVar26];
              lVar21 = (long)(int)uVar34 - (long)local_248;
              if (*(short *)((long)ppuVar33 + lVar21 * 2) == 0) {
                computeCellSize(&local_210,(int)lVar21);
                uVar32 = (ulong)local_268 & 0xffffffff;
                ppuVar33 = local_278;
              }
              uVar30 = uVar26 - 1;
              local_240 = (u8 *)(ulong)((uint)(uVar26 == local_108) * 2 - 2);
              lVar21 = (long)(int)uVar34 + 1;
              local_1e8 = uVar26;
              do {
                N = uVar34 - 1;
                if (*(short *)((long)ppuVar33 + lVar21 * 2 + -4) == 0) {
                  computeCellSize(&local_210,N);
                  uVar32 = (ulong)local_268 & 0xffffffff;
                  ppuVar33 = local_278;
                }
                if (uVar36 == 0) {
                  uVar11 = *(ushort *)((long)ppuVar33 + lVar21 * 2 + -4);
                  uVar14 = *(ushort *)((long)local_238 + lVar21 * 2 + -2) + 2;
                }
                else {
                  if ((char)local_f8 != '\0') break;
                  uVar14 = *(ushort *)((long)local_238 + lVar21 * 2 + -2) + uVar36 + 2;
                  uVar11 = *(ushort *)((long)ppuVar33 + lVar21 * 2 + -4);
                  if ((int)(((int)local_240 + uVar23) - (uint)uVar11) < (int)uVar14) break;
                }
                uVar23 = (uVar23 - uVar11) - 2;
                local_1b8[uVar30] = N;
                lVar21 = lVar21 + -1;
                uVar36 = uVar14;
                uVar34 = N;
              } while (1 < lVar21);
              auStack_188[local_1e8] = uVar36;
              auStack_188[uVar30] = uVar23;
              uVar23 = 0;
              if (local_1e8 != 1) {
                uVar23 = local_1b8[(int)local_1e8 - 2];
              }
              uVar26 = uVar30;
              uVar30 = local_250;
            } while ((int)uVar23 < (int)uVar34);
            uVar23 = 0;
            uVar19 = 0x11297;
LAB_0015ae2a:
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar19);
            PVar13 = 0xb;
            goto LAB_00159e7f;
          }
          uVar23 = 0;
          PVar13 = 7;
          goto LAB_00159e99;
        }
        PVar13 = 7;
        goto LAB_0015a8a2;
      }
      goto LAB_0015a8c4;
    }
LAB_0015b41f:
    PVar13 = 0;
  }
  goto LAB_0015b44f;
LAB_0015abb8:
  do {
    pBVar7 = local_228;
    if (local_220 < uVar40) {
      PVar13 = 1;
      if ((char)local_f8 == '\0') {
        PVar13 = local_214;
      }
      PVar13 = allocateBtreePage(local_228,(MemPage **)&local_f0,&local_214,PVar13,'\0');
      uVar30 = local_250;
      uVar23 = uVar36;
      local_27c = PVar13;
      if (PVar13 != 0) goto LAB_00159e7f;
      pMVar28 = (MemPage *)CONCAT44(local_f0._4_4_,(Pgno)local_f0);
      zeroPage(pMVar28,(int)local_278);
      local_130[uVar40 - 1] = (long)pMVar28;
      uVar32 = (ulong)local_268 & 0xffffffff;
      auStack_bc[uVar40 + 1] = (uint)local_268;
      if (pBVar7->autoVacuum != '\0') {
        ptrmapPut(pBVar7,pMVar28->pgno,'\x05',local_230->pgno,(int *)&local_27c);
        uVar32 = (ulong)local_268 & 0xffffffff;
        uVar30 = local_250;
        uVar23 = uVar36 + 1;
        PVar13 = local_27c;
        if (local_27c != 0) goto LAB_00159e7f;
      }
    }
    else {
      lVar21 = (&local_1d8)[uVar40];
      local_130[uVar40 - 1] = lVar21;
      (&local_1d8)[uVar40] = 0;
      PVar13 = sqlite3PagerWrite(*(PgHdr **)(lVar21 + 0x70));
      uVar23 = uVar36 + 1;
      uVar30 = local_250;
      local_27c = PVar13;
      if (PVar13 != 0) goto LAB_00159e7f;
      uVar32 = (ulong)local_268 & 0xffffffff;
    }
    uVar23 = uVar36 + 1;
    uVar40 = uVar40 + 1;
    uVar36 = uVar23;
  } while (uVar26 != uVar40);
  uVar30 = local_250;
  if ((int)uVar23 < 1) {
    local_260 = (u8 **)CONCAT44(local_260._4_4_,local_214);
    local_1f0 = (MemPage *)((ulong)local_1f0 & 0xffffffff00000000);
  }
  else {
    uVar40 = (ulong)uVar23;
    uVar26 = 0;
    do {
      lVar21 = local_130[uVar26 - 1];
      PVar13 = *(Pgno *)(lVar21 + 4);
      aPStack_68[uVar26] = PVar13;
      (&PStack_d8)[uVar26] = PVar13;
      auStack_80[uVar26] = *(u16 *)(*(long *)(lVar21 + 0x70) + 0x34);
      if (uVar26 != 0) {
        uVar25 = 0;
        do {
          if (aPStack_68[uVar25] == PVar13) {
            uVar19 = 0x112e1;
            goto LAB_0015ae2a;
          }
          uVar25 = uVar25 + 1;
        } while (uVar26 != uVar25);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar40);
    uVar26 = 0;
    do {
      uVar30 = 0;
      if (uVar23 != 1) {
        uVar16 = 1;
        uVar25 = 0;
        do {
          uVar30 = uVar16 & 0xffffffff;
          if ((&PStack_d8)[(int)uVar25] <= (&PStack_d8)[uVar16]) {
            uVar30 = uVar25;
          }
          uVar16 = uVar16 + 1;
          uVar25 = uVar30;
        } while (uVar40 != uVar16);
      }
      lVar21 = (long)(int)uVar30;
      local_260 = (u8 **)CONCAT44(local_260._4_4_,(&PStack_d8)[lVar21]);
      (&PStack_d8)[lVar21] = 0xffffffff;
      if (uVar26 != uVar30) {
        if ((long)uVar26 < lVar21) {
          pPVar9 = *(PgHdr **)(local_130[lVar21 + -1] + 0x70);
          uVar5 = local_228->nPage;
          pPVar9->flags = 0;
          sqlite3PcacheMove(pPVar9,(int)uVar30 + uVar5 + 1);
        }
        lVar38 = local_130[uVar26 - 1];
        pPVar9 = *(PgHdr **)(lVar38 + 0x70);
        pPVar9->flags = auStack_80[lVar21];
        PVar13 = (uint)local_260;
        sqlite3PcacheMove(pPVar9,(uint)local_260);
        *(Pgno *)(lVar38 + 4) = PVar13;
        uVar32 = (ulong)local_268 & 0xffffffff;
        uVar30 = extraout_RAX;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar40);
    local_1f0 = (MemPage *)CONCAT44(local_1f0._4_4_,(int)CONCAT71((int7)(uVar30 >> 8),1));
    uVar30 = local_250;
  }
LAB_0015ae55:
  local_214 = (uint)local_260;
  local_1e8 = (ulong)(int)uVar23;
  pvVar1 = (&local_140)[local_1e8];
  uVar36 = *(uint *)((long)pvVar1 + 4);
  *local_90 = uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 | uVar36 << 0x18;
  if ((((ulong)local_278 & 8) == 0) && (local_1e0._4_4_ != uVar23)) {
    ppMVar22 = (MemPage **)&local_1d8;
    if ((int)local_1e0._4_4_ < (int)uVar23) {
      ppMVar22 = &local_138;
    }
    *(undefined4 *)(*(long *)((long)pvVar1 + 0x50) + 8) =
         *(undefined4 *)(ppMVar22[local_220]->aData + 8);
  }
  if ((local_228->autoVacuum != '\0') && (0 < (int)uVar32)) {
    local_238 = (u8 **)CONCAT44(local_238._4_4_,(uint)((int)local_248 == 0));
    local_220 = (ulong)(int)local_228->usableSize;
    uVar40 = (ulong)((uint)local_138->nCell + (uint)local_138->nOverflow);
    local_260 = (u8 **)local_138->aData;
    uVar26 = 0;
    iVar18 = 0;
    iVar37 = 0;
    pMVar28 = local_138;
    do {
      if (uVar26 == uVar40) {
        lVar21 = (long)iVar18;
        iVar18 = iVar18 + 1;
        ppMVar22 = (MemPage **)&local_1d8;
        if (iVar18 < (int)uVar23) {
          ppMVar22 = &local_138;
        }
        pMVar6 = ppMVar22[lVar21 + 1];
        uVar40 = (ulong)((int)uVar40 + (int)local_238 + (uint)pMVar6->nCell +
                        (uint)pMVar6->nOverflow);
        local_260 = (u8 **)pMVar6->aData;
      }
      ppuVar33 = (u8 **)local_210.apCell[uVar26];
      iVar31 = iVar37;
      if (uVar26 == local_1b8[iVar37]) {
        iVar31 = iVar37 + 1;
        pMVar28 = (MemPage *)local_130[iVar37];
        iVar37 = iVar31;
        if ((int)local_248 != 0) goto LAB_0015af8b;
      }
      else {
LAB_0015af8b:
        iVar37 = iVar31;
        if (((((int)uVar23 <= iVar18) || (pMVar28->pgno != aPStack_68[iVar18])) ||
            (ppuVar33 < local_260)) || ((u8 **)(local_220 + (long)local_260) <= ppuVar33)) {
          if ((char)local_154 == '\0') {
            uVar36 = *(uint *)ppuVar33;
            local_278 = (u8 **)CONCAT44(local_278._4_4_,iVar31);
            local_268 = pMVar28;
            ptrmapPut(local_228,
                      uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                      uVar36 << 0x18,'\x05',pMVar28->pgno,(int *)&local_27c);
            pMVar28 = local_268;
            iVar37 = (int)local_278;
          }
          uVar11 = *(ushort *)((long)local_210.szCell + uVar26 * 2);
          if (uVar11 == 0) {
            local_278 = (u8 **)CONCAT44(local_278._4_4_,(int)uVar40);
            local_268 = pMVar28;
            uVar11 = computeCellSize(&local_210,(int)uVar26);
            uVar40 = (ulong)local_278 & 0xffffffff;
            pMVar28 = local_268;
          }
          if (pMVar28->minLocal < uVar11) {
            local_278 = (u8 **)CONCAT44(local_278._4_4_,(int)uVar40);
            ptrmapPutOvflPtr(pMVar28,(u8 *)ppuVar33,(int *)&local_27c);
            uVar40 = (ulong)local_278 & 0xffffffff;
          }
          PVar13 = local_27c;
          if (local_27c != 0) goto LAB_00159e7f;
          uVar32 = local_210._0_8_ & 0xffffffff;
        }
      }
      uVar26 = uVar26 + 1;
    } while ((long)uVar26 < (long)(int)uVar32);
  }
  local_268 = (MemPage *)CONCAT44(local_268._4_4_,(int)uVar32);
  if (1 < (int)uVar23) {
    local_260 = local_210.apCell;
    local_278 = (u8 **)local_210.szCell;
    local_220 = (ulong)(uVar23 - 1);
    local_238 = (u8 **)(local_100 & 0xffffffff);
    uVar26 = 0;
    iVar37 = 0;
    do {
      lVar21 = local_130[uVar26 - 1];
      lVar38 = (long)(int)local_1b8[uVar26];
      puVar27 = local_260[lVar38];
      uVar11 = *(ushort *)((long)local_278 + lVar38 * 2);
      uVar36 = (uint)uVar11 + (int)local_a0;
      puVar35 = (u8 *)((long)iVar37 + (long)local_140);
      if (*(char *)(lVar21 + 8) == '\0') {
        *(undefined4 *)(*(long *)(lVar21 + 0x50) + 8) = *(undefined4 *)puVar27;
      }
      else if ((int)local_248 == 0) {
        puVar27 = puVar27 + -4;
        if (uVar11 == 4) {
          local_240 = puVar27;
          uVar10 = (*local_230->xCellSize)(local_230,puVar27);
          uVar36 = (uint)uVar10;
          puVar27 = local_240;
        }
      }
      else {
        (**(code **)(lVar21 + 0x80))(lVar21,local_260[lVar38 + -1],&local_f0);
        iVar18 = sqlite3PutVarint(puVar35 + 4,CONCAT44(local_f0._4_4_,(Pgno)local_f0));
        uVar36 = iVar18 + 4;
        puVar27 = puVar35;
        puVar35 = (u8 *)0x0;
      }
      insertCell(local_230,(int)local_238 + (int)uVar26,puVar27,uVar36,puVar35,*(Pgno *)(lVar21 + 4)
                 ,(int *)&local_27c);
      PVar13 = local_27c;
      if (local_27c != 0) goto LAB_00159e7f;
      iVar37 = iVar37 + uVar36;
      uVar26 = uVar26 + 1;
      uVar32 = (ulong)local_268 & 0xffffffff;
    } while (local_220 != uVar26);
  }
  uVar36 = 1 - uVar23;
  cVar17 = local_269;
  if ((int)uVar36 < (int)uVar23) {
    local_248 = (undefined1 *)CONCAT44(local_248._4_4_,(uint)((int)local_248 == 0));
    local_260 = (u8 **)CONCAT44(local_260._4_4_,local_1b8[0]);
    iVar37 = uVar23 * 2 + -1;
    do {
      iVar18 = (int)uVar32;
      uVar34 = -uVar36;
      if (0 < (int)uVar36) {
        uVar34 = uVar36;
      }
      if (local_168[uVar34] == '\0') {
        if ((int)uVar36 < 0) {
          if ((int)(&uStack_1bc)[(int)uVar34] <= (int)auStack_bc[(int)uVar34]) goto LAB_0015b23f;
        }
        else {
          if (uVar36 == 0) {
            iNew = 0;
            iVar18 = 0;
            iVar31 = (uint)local_260;
          }
          else {
LAB_0015b23f:
            if ((uint)local_150 < uVar34) {
              uVar26 = (ulong)(uVar34 - 1);
            }
            else {
              uVar26 = (ulong)(int)(uVar34 - 1);
              iVar18 = auStack_bc[uVar26 + 1] + (int)local_248;
            }
            iNew = local_1b8[uVar26] + (int)local_248;
            iVar31 = local_1b8[uVar34] - iNew;
          }
          pMVar28 = (MemPage *)local_130[(ulong)uVar34 - 1];
          PVar13 = editPage(pMVar28,iVar18,iNew,iVar31,&local_210);
          uVar30 = local_250;
          if (PVar13 != 0) goto LAB_00159e7f;
          local_168[uVar34] = '\x01';
          pMVar28->nFree = (short)local_258 - (short)auStack_188[uVar34];
          uVar32 = (ulong)local_268 & 0xffffffff;
          cVar17 = local_269;
        }
      }
      uVar36 = uVar36 + 1;
      iVar37 = iVar37 + -1;
    } while (iVar37 != 0);
  }
  pMVar28 = local_138;
  pBVar7 = local_228;
  local_27c = 0;
  if (((cVar17 == '\x01') && (local_230->nCell == 0)) &&
     ((ushort)local_230->hdrOffset <= local_138->nFree)) {
    local_27c = defragmentPage(local_138,-1);
    copyNodeContent(pMVar28,local_230,(int *)&local_27c);
    iVar37 = (int)local_150;
    PVar13 = local_27c;
    if (local_27c == 0) {
      PVar13 = freePage2(pMVar28->pBt,pMVar28,pMVar28->pgno);
    }
  }
  else {
    iVar37 = (int)local_150;
    PVar13 = 0;
    if (((byte)local_1f0 & (char)local_154 == '\0' & local_228->autoVacuum != '\0') == 1) {
      uVar26 = 0;
      do {
        uVar36 = *(uint *)(*(long *)(local_130[uVar26 - 1] + 0x50) + 8);
        ptrmapPut(pBVar7,uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                         uVar36 << 0x18,'\x05',*(Pgno *)(local_130[uVar26 - 1] + 4),
                  (int *)&local_27c);
        uVar26 = uVar26 + 1;
      } while (uVar23 != uVar26);
      iVar37 = (int)local_150;
      PVar13 = local_27c;
    }
  }
  uVar26 = local_1e8;
  uVar30 = local_250;
  if ((int)uVar23 <= iVar37) {
    lVar21 = 0;
    do {
      if (PVar13 == 0) {
        pMVar28 = (MemPage *)(&local_1d8)[uVar26 + lVar21];
        PVar13 = freePage2(pMVar28->pBt,pMVar28,pMVar28->pgno);
      }
      lVar21 = lVar21 + 1;
      uVar30 = local_250;
    } while ((iVar37 - uVar23) + 1 != (int)lVar21);
  }
LAB_00159e7f:
  if (local_210.apCell != (u8 **)0x0) {
    sqlite3_free(local_210.apCell);
  }
LAB_00159e99:
  pCur = local_190;
  uVar26 = 0;
  do {
    if ((&local_1d8)[uVar26] != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)((&local_1d8)[uVar26] + 0x70));
    }
    pMVar28 = local_160;
    uVar26 = uVar26 + 1;
  } while (uVar30 != uVar26);
  if (0 < (int)uVar23) {
    uVar26 = 0;
    do {
      if (local_130[uVar26 - 1] != 0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(local_130[uVar26 - 1] + 0x70));
      }
      uVar26 = uVar26 + 1;
    } while (uVar23 != uVar26);
  }
LAB_0015a8a2:
  if (local_148 != (void *)0x0) {
    pcache1Free(local_148);
  }
  local_148 = local_140;
LAB_0015a8c4:
  pMVar28->nOverflow = '\0';
  sqlite3PagerUnrefNotNull(pMVar28->pDbPage);
  cVar17 = pCur->iPage + -1;
  pCur->iPage = cVar17;
  pMVar28 = pCur->apPage[cVar17];
LAB_0015a8ea:
  pCur->pPage = pMVar28;
  if (PVar13 != 0) {
LAB_0015b44f:
    if (local_148 != (void *)0x0) {
      pcache1Free(local_148);
    }
    return PVar13;
  }
  goto LAB_00159ab9;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}